

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_double<long_double>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          longdouble value,format_specs *spec)

{
  undefined8 uVar1;
  double_writer f;
  char t;
  bool bVar2;
  alignment aVar3;
  basic_format_specs<char> *in_RSI;
  align_spec *in_RDI;
  longdouble in_stack_00000008;
  type *it;
  align_spec as;
  size_t n;
  format_specs normalized_spec;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  write_inf_or_nan_t write_inf_or_nan;
  char sign;
  float_spec_handler<char> handler;
  float_spec_handler<char> *in_stack_fffffffffffffcc8;
  allocator<char> *alloc;
  size_t n_00;
  undefined2 uVar4;
  undefined5 in_stack_fffffffffffffcd2;
  undefined5 uVar5;
  char in_stack_fffffffffffffcd7;
  undefined1 uVar6;
  char *in_stack_fffffffffffffcd8;
  write_inf_or_nan_t *in_stack_fffffffffffffce0;
  undefined2 in_stack_fffffffffffffce8;
  allocator<char> local_2f1;
  float_spec_handler<char> *this_00;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this_01;
  undefined1 in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd31;
  format_specs *in_stack_fffffffffffffd38;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  undefined2 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  allocator<char> local_269;
  basic_buffer<char> local_268 [17];
  undefined8 local_48;
  undefined5 uStack_40;
  undefined3 uStack_3b;
  undefined5 uStack_38;
  allocator<char> local_30;
  allocator<char> local_23;
  float_spec_handler<char> local_22;
  basic_format_specs<char> *local_20;
  longdouble local_18;
  
  local_18 = in_stack_00000008;
  local_20 = in_RSI;
  t = basic_format_specs<char>::type(in_RSI);
  this_00 = &local_22;
  float_spec_handler<char>::float_spec_handler(this_00,t);
  basic_format_specs<char>::type(local_20);
  internal::handle_float_type_spec<char,fmt::v5::float_spec_handler<char>&>
            (in_stack_fffffffffffffcd7,in_stack_fffffffffffffcc8);
  local_23 = (allocator<char>)0x0;
  this_01 = (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
            (double)local_18;
  bVar2 = std::numeric_limits<fmt::v5::internal::dummy_int>::isnegative
                    ((double)in_stack_fffffffffffffcd8);
  if (bVar2) {
    local_23 = (allocator<char>)0x2d;
    local_18 = -local_18;
  }
  else {
    bVar2 = basic_format_specs<char>::flag(local_20,1);
    if (bVar2) {
      bVar2 = basic_format_specs<char>::flag(local_20,2);
      local_2f1 = (allocator<char>)0x2b;
      if (!bVar2) {
        local_2f1 = (allocator<char>)0x20;
      }
      local_23 = local_2f1;
    }
  }
  uStack_38 = (undefined5)((ulong)*(undefined8 *)((long)&local_20->flags_ + 1) >> 0x18);
  local_48._0_4_ = (local_20->super_align_spec).width_;
  local_48._4_4_ = (local_20->super_align_spec).fill_;
  uVar1 = *(undefined8 *)&(local_20->super_align_spec).align_;
  uStack_40 = (undefined5)uVar1;
  uStack_3b = (undefined3)((ulong)uVar1 >> 0x28);
  local_30 = local_23;
  bVar2 = std::numeric_limits<fmt::v5::internal::dummy_int>::isnotanumber<long_double>
                    ((longdouble)CONCAT28(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0));
  if (bVar2) {
    write_double<long_double>::write_inf_or_nan_t::operator()
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  else {
    alloc = SUB108(local_18,0);
    uVar4 = (undefined2)((unkuint10)local_18 >> 0x40);
    bVar2 = std::numeric_limits<fmt::v5::internal::dummy_int>::isinfinity<long_double>
                      ((longdouble)CONCAT28(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0));
    if (bVar2) {
      write_double<long_double>::write_inf_or_nan_t::operator()
                (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    }
    else {
      std::allocator<char>::allocator();
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcd7,CONCAT52(in_stack_fffffffffffffcd2,uVar4)),alloc
                );
      std::allocator<char>::~allocator(&local_269);
      n_00 = SUB108(local_18,0);
      uVar4 = (undefined2)((unkuint10)local_18 >> 0x40);
      write_double_sprintf<long_double>
                ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 (longdouble)CONCAT28(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40),
                 in_stack_fffffffffffffd38,
                 (basic_buffer<char> *)CONCAT71(in_stack_fffffffffffffd31,in_stack_fffffffffffffd30)
                );
      internal::basic_buffer<char>::size(local_268);
      aVar3 = align_spec::align(&local_20->super_align_spec);
      if (aVar3 == ALIGN_NUMERIC) {
        if (local_23 != (allocator<char>)0x0) {
          in_stack_fffffffffffffd40 =
               (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
               reserve((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                        *)CONCAT17(in_stack_fffffffffffffcd7,
                                   CONCAT52(in_stack_fffffffffffffcd2,uVar4)),n_00);
          in_stack_fffffffffffffd40->super_allocator<char> = local_23;
          local_23 = (allocator<char>)0x0;
        }
      }
      else {
        align_spec::align(&local_20->super_align_spec);
      }
      uVar4 = (undefined2)CONCAT71(in_stack_fffffffffffffd31,local_23);
      uVar5 = (undefined5)((uint7)in_stack_fffffffffffffd31 >> 8);
      uVar6 = (undefined1)((uint7)in_stack_fffffffffffffd31 >> 0x30);
      f.n._1_7_ = in_stack_fffffffffffffd31;
      f.n._0_1_ = local_23;
      f._8_8_ = local_268;
      f.buffer = in_stack_fffffffffffffd40;
      basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
      write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::double_writer>
                (this_01,(size_t)this_00,in_RDI,f);
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 CONCAT17(uVar6,CONCAT52(uVar5,uVar4)));
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler<char_type> handler(spec.type());
  internal::handle_float_type_spec(spec.type(), handler);

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::fputil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(INF_SIZE + (sign ? 1 : 0), spec,
                          inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  basic_memory_buffer<char_type> buffer;
  if (FMT_USE_GRISU && sizeof(T) <= sizeof(double) &&
      std::numeric_limits<double>::is_iec559) {
    internal::fp fp_value(static_cast<double>(value));
    fp_value.normalize();
    // Find a cached power of 10 close to 1 / fp_value.
    int dec_exp = 0;
    const int min_exp = -60;
    auto dec_pow = internal::get_cached_power(
        min_exp - (fp_value.e + internal::fp::significand_size), dec_exp);
    internal::fp product = fp_value * dec_pow;
    // Generate output.
    internal::fp one(1ull << -product.e, product.e);
    uint64_t hi = product.f >> -one.e;
    uint64_t f = product.f & (one.f - 1);
    typedef back_insert_range<internal::basic_buffer<char_type>> range;
    basic_writer<range> w{range(buffer)};
    w.write(hi);
    size_t digits = buffer.size();
    w.write('.');
    const unsigned max_digits = 18;
    while (digits++ < max_digits) {
      f *= 10;
      w.write(static_cast<char>('0' + (f >> -one.e)));
      f &= one.f - 1;
    }
    w.write('e');
    w.write(-dec_exp);
  } else {
    format_specs normalized_spec(spec);
    normalized_spec.type_ = handler.type;
    write_double_sprintf(value, normalized_spec, buffer);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = sign;
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(n, as, double_writer{n, sign, buffer});
}